

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M7Getter.cpp
# Opt level: O3

bool __thiscall
M7Getter::ParseRecord
          (M7Getter *this,char *buffer,char **p_tld,size_t *tld_length,bool *has_ds,
          uint32_t *algo_code)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  byte bVar8;
  char cVar9;
  
  *p_tld = buffer;
  *tld_length = 0;
  *has_ds = false;
  *algo_code = 0;
  bVar8 = *buffer;
  iVar1 = 0;
  if (bVar8 != 0) {
    uVar4 = 0;
    do {
      if ((0x19 < (byte)((bVar8 & 0xdf) + 0xbf)) && (bVar8 != 0x2d && 9 < (byte)(bVar8 - 0x30))) {
        if (bVar8 != 0x2e) break;
        iVar1 = iVar1 + 1;
      }
      bVar8 = buffer[uVar4 + 1];
      uVar4 = uVar4 + 1;
    } while (bVar8 != 0);
    if (2 < uVar4 && iVar1 < 2) {
      *tld_length = uVar4 - 1;
      bVar8 = buffer[uVar4];
      if ((bVar8 == 0x20) || (bVar8 == 9)) {
        do {
          do {
            uVar4 = uVar4 + 1;
            bVar8 = buffer[uVar4];
          } while (bVar8 == 0x20);
        } while (bVar8 == 9);
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
      if ((byte)(bVar8 - 0x3a) < 0xf6) {
        bVar3 = false;
      }
      else {
        do {
          bVar8 = buffer[uVar4 + 1];
          uVar4 = uVar4 + 1;
        } while ((byte)(bVar8 - 0x30) < 10);
      }
      if ((bVar8 == 0x20) || (bVar8 == 9)) {
        do {
          do {
            uVar4 = uVar4 + 1;
            bVar8 = buffer[uVar4];
          } while (bVar8 == 0x20);
        } while (bVar8 == 9);
      }
      else {
        bVar3 = false;
      }
      if (((bVar8 | 0x20) == 0x69) && ((byte)(buffer[uVar4 + 1] | 0x20U) == 0x6e)) {
        bVar8 = buffer[uVar4 + 2];
        uVar4 = uVar4 + 2;
      }
      else {
        bVar3 = false;
      }
      if ((bVar8 == 0x20) || (bVar8 == 9)) {
        do {
          do {
            uVar4 = uVar4 + 1;
            bVar8 = buffer[uVar4];
          } while (bVar8 == 0x20);
        } while (bVar8 == 9);
      }
      else {
        bVar3 = false;
      }
      if ((((bVar8 | 0x20) == 100) && ((byte)(buffer[uVar4 + 1] | 0x20U) == 0x73)) &&
         ((buffer[uVar4 + 2] == ' ' || (buffer[uVar4 + 2] == '\t')))) {
        *has_ds = true;
        for (lVar5 = uVar4 + 3; (cVar9 = buffer[lVar5], cVar9 == ' ' || (cVar9 == '\t'));
            lVar5 = lVar5 + 1) {
        }
        if ((byte)(cVar9 - 0x3aU) < 0xf6) {
          bVar3 = false;
        }
        else {
          do {
            cVar9 = buffer[lVar5 + 1];
            lVar5 = lVar5 + 1;
          } while ((byte)(cVar9 - 0x30U) < 10);
        }
        if ((cVar9 == ' ') || (cVar9 == '\t')) {
          do {
            do {
              lVar5 = lVar5 + 1;
              cVar9 = buffer[lVar5];
            } while (cVar9 == ' ');
          } while (cVar9 == '\t');
        }
        else {
          bVar3 = false;
        }
        uVar2 = 0;
        if ((byte)(cVar9 - 0x3aU) < 0xf6) {
          return false;
        }
        pcVar7 = buffer + lVar5;
        do {
          pcVar6 = pcVar7 + 1;
          if (0x1ffffff < uVar2) {
            return false;
          }
          *algo_code = uVar2 * 10;
          uVar2 = (uVar2 * 10 + (int)*pcVar7) - 0x30;
          *algo_code = uVar2;
          pcVar7 = pcVar6;
        } while ((byte)(*pcVar6 - 0x30U) < 10);
      }
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool M7Getter::ParseRecord(char * buffer, char ** p_tld, size_t * tld_length, bool * has_ds, uint32_t* algo_code)
{
    bool ret = true;
    size_t i = 0;
    int x;
    int nb_dots = 0;


    *p_tld = buffer;
    *tld_length = 0;
    *has_ds = false;
    *algo_code = 0;

    for (i = 0; (x = buffer[i]) != 0; i++)
    {
        if ((x >= 'a' && x <= 'z') || (x >= 'A' && x <= 'Z') ||
            (x >= '0' && x <= '9') || (x == '-'))
        {
            continue;
        }
        else if (x == '.')
        {
            nb_dots++;
        }
        else
        {
            break;
        }
    }

    if (i <= 2 || nb_dots > 1)
    {
        ret = false;
    }
    else
    {
        *tld_length = i - 1;

        /* skip spaces */
        if (buffer[i] != ' ' && buffer[i] != '\t')
        {
            ret = false;
        }
        else
        {
            do
            {
                i++;
            } while (buffer[i] == ' ' || buffer[i] == '\t');
        }
        /* skip TTL */
        if (buffer[i] < '0' || buffer[i] > '9')
        {
            ret = false;
        }
        else
        {
            do
            {
                i++;
            } while (buffer[i] >= '0' && buffer[i] <= '9');
        }
        /* skip more spaces */
        if (buffer[i] != ' ' && buffer[i] != '\t')
        {
            ret = false;
        }
        else
        {
            do
            {
                i++;
            } while (buffer[i] == ' ' || buffer[i] == '\t');
        }
        /* skip CLASS */
        if ((buffer[i] == 'i' || buffer[i] == 'I') &&
            (buffer[i+1] == 'n' || buffer[i+1] == 'N'))
        {
            i += 2;
        }
        else
        {
            ret = false;
        }
        /* skip more space*/
        if (buffer[i] != ' ' && buffer[i] != '\t')
        {
            ret = false;
        }
        else
        {
            do
            {
                i++;
            } while (buffer[i] == ' ' || buffer[i] == '\t');
        }
        /* check ds_bit */
        if ((buffer[i] == 'd' || buffer[i] == 'D') &&
            (buffer[i + 1] == 's' || buffer[i + 1] == 'S') &&
            (buffer[i + 2] == ' ' || buffer[i + 2] == '\t'))
        {
            *has_ds = true;
            i += 2;
            /* skip space until next number */
            do
            {
                i++;
            } while (buffer[i] == ' ' || buffer[i] == '\t');

            /* skip digits (key ID) */
            if (buffer[i] < '0' || buffer[i] > '9')
            {
                ret = false;
            }
            else
            {
                do
                {
                    i++;
                } while (buffer[i] >= '0' && buffer[i] <= '9');
            }
            /* Skip more spaces */
            if (buffer[i] != ' ' && buffer[i] != '\t')
            {
                ret = false;
            }
            else
            {
                do
                {
                    i++;
                } while (buffer[i] == ' ' || buffer[i] == '\t');
            }
            /* Compute algorithm number */
            if (buffer[i] < '0' || buffer[i] > '9')
            {
                ret = false;
            }
            else while (buffer[i] >= '0' && buffer[i] <= '9')
            {
                if (*algo_code > 0x1FFFFFF) {
                    ret = false;
                    break;
                }
                *algo_code *= 10;
                *algo_code += (uint32_t)(buffer[i] - '0');
                i++;
            }
        }
    }

    return ret;
}